

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

void __thiscall docopt::value::throwIfNotKind(value *this,Kind expected)

{
  char *pcVar1;
  runtime_error *this_00;
  Kind in_ESI;
  Kind *in_RDI;
  string error;
  allocator local_31;
  string local_30 [36];
  Kind local_c;
  
  if (*in_RDI == in_ESI) {
    return;
  }
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Illegal cast to ",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar1 = kindAsString(local_c);
  std::__cxx11::string::operator+=(local_30,pcVar1);
  std::__cxx11::string::operator+=(local_30,"; type is actually ");
  pcVar1 = kindAsString(*in_RDI);
  std::__cxx11::string::operator+=(local_30,pcVar1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwIfNotKind(Kind expected) const {
			if (kind == expected)
				return;

			std::string error = "Illegal cast to ";
			error += kindAsString(expected);
			error += "; type is actually ";
			error += kindAsString(kind);
			throw std::runtime_error(std::move(error));
		}